

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::flush_phi(CompilerGLSL *this,BlockID from,BlockID to)

{
  VariableID *ts_1;
  uint32_t uVar1;
  bool bVar2;
  SPIRBlock *pSVar3;
  SPIRVariable *pSVar4;
  Phi *pPVar5;
  size_type sVar6;
  SPIRType *type;
  Phi *pPVar7;
  Phi *pPVar8;
  long lVar9;
  SPIRVariable *ts_2;
  Phi *ts;
  Phi *pPVar10;
  string rhs;
  string lhs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  temporary_phi_variables;
  string local_d0;
  undefined1 local_b0 [32];
  SPIRBlock *local_90;
  string local_88;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pSVar3 = Variant::get<spirv_cross::SPIRBlock>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      to.id);
  if ((pSVar3->ignore_phi_from_block).id != from.id) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    if ((pSVar3->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size != 0) {
      ts = (pSVar3->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
      pPVar10 = ts + 3;
      local_90 = pSVar3;
      do {
        if ((ts->parent).id == from.id) {
          pSVar4 = Variant::get<spirv_cross::SPIRVariable>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + (ts->function_variable).id);
          ts_1 = &ts->function_variable;
          if ((pSVar4->loop_variable == true) && (pSVar4->loop_variable_enable == false)) {
            (pSVar4->static_expression).id = (ts->local_variable).id;
          }
          else {
            flush_variable_declaration(this,ts_1->id);
            pPVar7 = ts + 1;
            pPVar5 = (local_90->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr +
                     (local_90->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.
                     buffer_size;
            lVar9 = ((long)pPVar5 - (long)pPVar7 >> 2) * -0x5555555555555555 >> 2;
            if (0 < lVar9) {
              uVar1 = ts_1->id;
              pPVar7 = pPVar7 + lVar9 * 4;
              lVar9 = lVar9 + 1;
              pPVar8 = pPVar10;
              do {
                if ((pPVar8[-2].local_variable.id == uVar1) && (pPVar8[-2].parent.id == from.id)) {
                  pPVar8 = pPVar8 + -2;
                  goto LAB_00215018;
                }
                if ((pPVar8[-1].local_variable.id == uVar1) && (pPVar8[-1].parent.id == from.id)) {
                  pPVar8 = pPVar8 + -1;
                  goto LAB_00215018;
                }
                if (((pPVar8->local_variable).id == uVar1) && ((pPVar8->parent).id == from.id))
                goto LAB_00215018;
                if ((pPVar8[1].local_variable.id == uVar1) && (pPVar8[1].parent.id == from.id)) {
                  pPVar8 = pPVar8 + 1;
                  goto LAB_00215018;
                }
                lVar9 = lVar9 + -1;
                pPVar8 = pPVar8 + 4;
              } while (1 < lVar9);
            }
            lVar9 = ((long)pPVar5 - (long)pPVar7 >> 2) * -0x5555555555555555;
            if (lVar9 == 1) {
LAB_00214fec:
              pPVar8 = pPVar5;
              if (((pPVar7->local_variable).id == ts_1->id) &&
                 (pPVar8 = pPVar7, (pPVar7->parent).id != from.id)) {
                pPVar8 = pPVar5;
              }
            }
            else if (lVar9 == 2) {
LAB_00214fcb:
              if (((pPVar7->local_variable).id != ts_1->id) ||
                 (pPVar8 = pPVar7, (pPVar7->parent).id != from.id)) {
                pPVar7 = pPVar7 + 1;
                goto LAB_00214fec;
              }
            }
            else {
              pPVar8 = pPVar5;
              if ((lVar9 == 3) &&
                 (((pPVar7->local_variable).id != ts_1->id ||
                  (pPVar8 = pPVar7, (pPVar7->parent).id != from.id)))) {
                pPVar7 = pPVar7 + 1;
                goto LAB_00214fcb;
              }
            }
LAB_00215018:
            ts_2 = pSVar4;
            if (pPVar8 != pPVar5) {
              if (pSVar4->allocate_temporary_copy == false) {
                pSVar4->allocate_temporary_copy = true;
                Compiler::force_recompile(&this->super_Compiler);
              }
              (*(this->super_Compiler)._vptr_Compiler[6])
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,this,(ulong)ts_1->id,1);
              ts_2 = (SPIRVariable *)0x35ef26;
              statement<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&,char_const(&)[6],char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                        (this,(char (*) [2])0x34c680,ts_1,(char (*) [6])0x3481a3,
                         (char (*) [4])0x35ef26,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,(char (*) [2])0x347553);
              if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_b0._0_8_ !=
                  (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)(local_b0 + 0x10)) {
                operator_delete((void *)local_b0._0_8_);
              }
              local_d0._M_dataplus._M_p._0_4_ = ts_1->id;
              local_b0._0_8_ = &local_68;
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_b0._0_8_,&local_d0,local_b0);
            }
            to_expression_abi_cxx11_((string *)local_b0,this,ts_1->id,true);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            local_d0._M_string_length = 0;
            local_d0.field_2._M_local_buf[0] = '\0';
            local_88._M_dataplus._M_p._0_4_ = (ts->local_variable).id;
            sVar6 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&local_68,(key_type *)&local_88);
            if (sVar6 == 0) {
              to_pointer_expression_abi_cxx11_(&local_88,this,(ts->local_variable).id,true);
            }
            else {
              join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[6]>
                        (&local_88,(spirv_cross *)0x34c680,(char (*) [2])ts,
                         (TypedID<(spirv_cross::Types)0> *)0x3481a3,(char (*) [6])ts_2);
            }
            ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_88._M_dataplus._M_p._4_4_,(uint32_t)local_88._M_dataplus._M_p) !=
                &local_88.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_88._M_dataplus._M_p));
            }
            type = Variant::get<spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)&(pSVar4->super_IVariant).field_0xc);
            bVar2 = optimize_read_modify_write
                              (this,type,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,&local_d0);
            if (!bVar2) {
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,(char (*) [4])0x35ef26,&local_d0,(char (*) [2])0x347553);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_b0._0_8_ !=
                (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_b0 + 0x10)) {
              operator_delete((void *)local_b0._0_8_);
            }
          }
          Compiler::register_write(&this->super_Compiler,ts_1->id);
        }
        ts = ts + 1;
        pPVar10 = pPVar10 + 1;
      } while (ts != (local_90->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr +
                     (local_90->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.
                     buffer_size);
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_phi(BlockID from, BlockID to)
{
	auto &child = get<SPIRBlock>(to);
	if (child.ignore_phi_from_block == from)
		return;

	unordered_set<uint32_t> temporary_phi_variables;

	for (auto itr = begin(child.phi_variables); itr != end(child.phi_variables); ++itr)
	{
		auto &phi = *itr;

		if (phi.parent == from)
		{
			auto &var = get<SPIRVariable>(phi.function_variable);

			// A Phi variable might be a loop variable, so flush to static expression.
			if (var.loop_variable && !var.loop_variable_enable)
				var.static_expression = phi.local_variable;
			else
			{
				flush_variable_declaration(phi.function_variable);

				// Check if we are going to write to a Phi variable that another statement will read from
				// as part of another Phi node in our target block.
				// For this case, we will need to copy phi.function_variable to a temporary, and use that for future reads.
				// This is judged to be extremely rare, so deal with it here using a simple, but suboptimal algorithm.
				bool need_saved_temporary =
				    find_if(itr + 1, end(child.phi_variables), [&](const SPIRBlock::Phi &future_phi) -> bool {
					    return future_phi.local_variable == ID(phi.function_variable) && future_phi.parent == from;
				    }) != end(child.phi_variables);

				if (need_saved_temporary)
				{
					// Need to make sure we declare the phi variable with a copy at the right scope.
					// We cannot safely declare a temporary here since we might be inside a continue block.
					if (!var.allocate_temporary_copy)
					{
						var.allocate_temporary_copy = true;
						force_recompile();
					}
					statement("_", phi.function_variable, "_copy", " = ", to_name(phi.function_variable), ";");
					temporary_phi_variables.insert(phi.function_variable);
				}

				// This might be called in continue block, so make sure we
				// use this to emit ESSL 1.0 compliant increments/decrements.
				auto lhs = to_expression(phi.function_variable);

				string rhs;
				if (temporary_phi_variables.count(phi.local_variable))
					rhs = join("_", phi.local_variable, "_copy");
				else
					rhs = to_pointer_expression(phi.local_variable);

				if (!optimize_read_modify_write(get<SPIRType>(var.basetype), lhs, rhs))
					statement(lhs, " = ", rhs, ";");
			}

			register_write(phi.function_variable);
		}
	}
}